

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O2

int intra_mode_info_cost_uv
              (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int mode_cost)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint16_t color_cache [16];
  
  bVar1 = (mbmi->palette_mode_info).palette_size[1];
  bVar2 = mbmi->uv_mode;
  iVar3 = av1_allow_palette((uint)(cpi->common).features.allow_screen_content_tools,mbmi->bsize);
  if (bVar2 == 0 && iVar3 != 0) {
    mode_cost = mode_cost +
                (x->mode_costs).palette_uv_mode_cost
                [(mbmi->palette_mode_info).palette_size[0] != '\0'][bVar1 != 0];
    if (bVar1 != 0) {
      iVar3 = (x->mode_costs).palette_y_size_cost
              ["\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bsize]]
              [(ulong)bVar1 + 5];
      iVar4 = write_uniform_cost((uint)bVar1,(uint)*(x->e_mbd).plane[1].color_index_map);
      iVar5 = av1_get_palette_cache(&x->e_mbd,1,color_cache);
      iVar5 = av1_palette_color_cost_uv
                        (&mbmi->palette_mode_info,color_cache,iVar5,
                         ((cpi->common).seq_params)->bit_depth);
      iVar6 = av1_cost_color_map(x,1,bsize,mbmi->tx_size,'\0');
      mode_cost = mode_cost + iVar3 + iVar5 + iVar4 + iVar6;
    }
  }
  if ((BLOCK_8X4 < bsize) && (0xf7 < (byte)(get_uv_mode_uv2y[bVar2] - 9))) {
    mode_cost = mode_cost +
                (x->mode_costs).angle_delta_cost[(ulong)(byte)get_uv_mode_uv2y[bVar2] - 1]
                [(long)mbmi->angle_delta[1] + 3];
  }
  return mode_cost;
}

Assistant:

static inline int intra_mode_info_cost_uv(const AV1_COMP *cpi,
                                          const MACROBLOCK *x,
                                          const MB_MODE_INFO *mbmi,
                                          BLOCK_SIZE bsize, int mode_cost) {
  int total_rate = mode_cost;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int use_palette = mbmi->palette_mode_info.palette_size[1] > 0;
  const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
  // Can only activate one mode.
  assert(((uv_mode != UV_DC_PRED) + use_palette + mbmi->use_intrabc) <= 1);

  const int try_palette = av1_allow_palette(
      cpi->common.features.allow_screen_content_tools, mbmi->bsize);
  if (try_palette && uv_mode == UV_DC_PRED) {
    const PALETTE_MODE_INFO *pmi = &mbmi->palette_mode_info;
    total_rate +=
        mode_costs->palette_uv_mode_cost[pmi->palette_size[0] > 0][use_palette];
    if (use_palette) {
      const int bsize_ctx = av1_get_palette_bsize_ctx(bsize);
      const int plt_size = pmi->palette_size[1];
      const MACROBLOCKD *xd = &x->e_mbd;
      const uint8_t *const color_map = xd->plane[1].color_index_map;
      int palette_mode_cost =
          mode_costs
              ->palette_uv_size_cost[bsize_ctx][plt_size - PALETTE_MIN_SIZE] +
          write_uniform_cost(plt_size, color_map[0]);
      uint16_t color_cache[2 * PALETTE_MAX_SIZE];
      const int n_cache = av1_get_palette_cache(xd, 1, color_cache);
      palette_mode_cost += av1_palette_color_cost_uv(
          pmi, color_cache, n_cache, cpi->common.seq_params->bit_depth);
      palette_mode_cost +=
          av1_cost_color_map(x, 1, bsize, mbmi->tx_size, PALETTE_MAP);
      total_rate += palette_mode_cost;
    }
  }
  const PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
  if (av1_is_directional_mode(intra_mode)) {
    if (av1_use_angle_delta(bsize)) {
      total_rate +=
          mode_costs->angle_delta_cost[intra_mode - V_PRED]
                                      [mbmi->angle_delta[PLANE_TYPE_UV] +
                                       MAX_ANGLE_DELTA];
    }
  }
  return total_rate;
}